

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

deUint32 __thiscall
tcu::astc::anon_unknown_0::BitAccessStream::getNext(BitAccessStream *this,int num)

{
  int iVar1;
  int numBits;
  deUint32 src;
  int iVar2;
  deUint32 local_3c;
  int high;
  int low;
  int numBitsFromSrc;
  int end;
  int num_local;
  BitAccessStream *this_local;
  
  if ((num == 0) || (this->m_length <= this->m_ndx)) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = de::min<int>(this->m_length,this->m_ndx + num);
    numBits = de::max<int>(0,iVar1 - this->m_ndx);
    iVar1 = this->m_ndx;
    iVar2 = this->m_ndx + numBits + -1;
    this->m_ndx = num + this->m_ndx;
    if ((this->m_forward & 1U) == 0) {
      src = Block128::getBits(this->m_src,this->m_startNdxInSrc - iVar2,
                              this->m_startNdxInSrc - iVar1);
      local_3c = reverseBits(src,numBits);
    }
    else {
      local_3c = Block128::getBits(this->m_src,this->m_startNdxInSrc + iVar1,
                                   this->m_startNdxInSrc + iVar2);
    }
    this_local._4_4_ = local_3c;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 getNext (int num)
	{
		if (num == 0 || m_ndx >= m_length)
			return 0;

		const int end				= m_ndx + num;
		const int numBitsFromSrc	= de::max(0, de::min(m_length, end) - m_ndx);
		const int low				= m_ndx;
		const int high				= m_ndx + numBitsFromSrc - 1;

		m_ndx += num;

		return m_forward ?			   m_src.getBits(m_startNdxInSrc + low,  m_startNdxInSrc + high)
						 : reverseBits(m_src.getBits(m_startNdxInSrc - high, m_startNdxInSrc - low), numBitsFromSrc);
	}